

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_STRNOTIN_Test::Body(iu_AssertionTest_x_iutest_x_STRNOTIN_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionHelper local_16e0;
  Fixed local_16b0;
  undefined1 local_1528 [8];
  AssertionResult iutest_ar_11;
  Fixed local_14d0;
  undefined1 local_1348 [8];
  AssertionResult iutest_ar_10;
  Fixed local_12f0;
  undefined1 local_1168 [8];
  AssertionResult iutest_ar_9;
  Fixed local_1110;
  undefined1 local_f88 [8];
  AssertionResult iutest_ar_8;
  Fixed local_f30;
  undefined1 local_da8 [8];
  AssertionResult iutest_ar_7;
  Fixed local_d50;
  undefined1 local_bc8 [8];
  AssertionResult iutest_ar_6;
  Fixed local_b70;
  undefined1 local_9e8 [8];
  AssertionResult iutest_ar_5;
  Fixed local_990;
  undefined1 local_808 [8];
  AssertionResult iutest_ar_4;
  Fixed local_7b0;
  undefined1 local_628 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5d0;
  undefined1 local_448 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3f0;
  undefined1 local_268 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_238;
  Fixed local_208;
  undefined1 local_80 [8];
  AssertionResult iutest_ar;
  allocator<char> local_41;
  string local_40 [8];
  string str;
  char *null;
  char test [5];
  iu_AssertionTest_x_iutest_x_STRNOTIN_Test *this_local;
  
  null._4_1_ = 0;
  null._0_4_ = 0x74736574;
  str.field_2._8_8_ = 0;
  _test = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,(char *)&null,&local_41);
  std::allocator<char>::~allocator(&local_41);
  iutest::detail::AlwaysZero();
  iuutil::CmpHelperSTRNOTIN<char[4],char[5]>
            ((AssertionResult *)local_80,(iuutil *)"\"Tes\"","test","Tes",(char (*) [4])&null,
             (char (*) [5])in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    memset(&local_208,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_208);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_80);
    iutest::AssertionHelper::AssertionHelper
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
               ,0x14f,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_238,&local_208);
    iutest::AssertionHelper::~AssertionHelper(&local_238);
    iutest::AssertionHelper::Fixed::~Fixed(&local_208);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperSTRNOTIN<char[4],char[5]>
              ((AssertionResult *)local_268,(iuutil *)"\"Tes\"","test","Tes",(char (*) [4])&null,
               (char (*) [5])in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar1) {
      memset(&local_3f0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3f0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_268);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x150,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3f0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3f0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_268);
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperSTRNOTIN<char[4],char[5]>
              ((AssertionResult *)local_448,(iuutil *)"\"Tes\"","test","Tes",(char (*) [4])&null,
               (char (*) [5])in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
    if (!bVar1) {
      memset(&local_5d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5d0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_448);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x151,pcVar2,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5d0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5d0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_448);
    iutest::detail::AlwaysZero();
    iuutil::CmpHelperSTRNOTIN<char[4],char[5]>
              ((AssertionResult *)local_628,(iuutil *)"\"Tes\"","test","Tes",(char (*) [4])&null,
               (char (*) [5])in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
    if (!bVar1) {
      memset(&local_7b0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7b0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_628);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_4.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x152,pcVar2,kAssumeFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_7b0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7b0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_628);
    if (iutest_ar_1._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      iuutil::CmpHelperSTRNOTIN<char[4],std::__cxx11::string>
                ((AssertionResult *)local_808,(iuutil *)"\"Tes\"","str","Tes",(char (*) [4])local_40
                 ,in_R9);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
      if (!bVar1) {
        memset(&local_990,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_990);
        pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_808);
        iutest::AssertionHelper::AssertionHelper
                  ((AssertionHelper *)&iutest_ar_5.m_result,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                   ,0x154,pcVar2,kFatalFailure);
        iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_990);
        iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
        iutest::AssertionHelper::Fixed::~Fixed(&local_990);
      }
      iutest_ar_1._37_3_ = 0;
      iutest_ar_1._36_1_ = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_808);
      if (iutest_ar_1._36_4_ == 0) {
        iutest::detail::AlwaysZero();
        iuutil::CmpHelperSTRNOTIN<char[4],std::__cxx11::string>
                  ((AssertionResult *)local_9e8,(iuutil *)"\"Tes\"","str","Tes",
                   (char (*) [4])local_40,in_R9);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
        if (!bVar1) {
          memset(&local_b70,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_b70);
          pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9e8);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_ar_6.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x155,pcVar2,kNonFatalFailure);
          iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_6.m_result,&local_b70);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
          iutest::AssertionHelper::Fixed::~Fixed(&local_b70);
        }
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
        iutest::detail::AlwaysZero();
        iuutil::CmpHelperSTRNOTIN<char[4],std::__cxx11::string>
                  ((AssertionResult *)local_bc8,(iuutil *)"\"Tes\"","str","Tes",
                   (char (*) [4])local_40,in_R9);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc8);
        if (!bVar1) {
          memset(&local_d50,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_d50);
          pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_bc8);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_ar_7.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x156,pcVar2,kWarning);
          iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_7.m_result,&local_d50);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_7.m_result);
          iutest::AssertionHelper::Fixed::~Fixed(&local_d50);
        }
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_bc8);
        iutest::detail::AlwaysZero();
        iuutil::CmpHelperSTRNOTIN<char[4],std::__cxx11::string>
                  ((AssertionResult *)local_da8,(iuutil *)"\"Tes\"","str","Tes",
                   (char (*) [4])local_40,in_R9);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da8);
        if (!bVar1) {
          memset(&local_f30,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_f30);
          pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_da8);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_ar_8.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x157,pcVar2,kAssumeFailure);
          iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_8.m_result,&local_f30);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_8.m_result);
          iutest::AssertionHelper::Fixed::~Fixed(&local_f30);
        }
        iutest_ar_1._37_3_ = 0;
        iutest_ar_1._36_1_ = !bVar1;
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_da8);
        if (iutest_ar_1._36_4_ == 0) {
          iutest::detail::AlwaysZero();
          iuutil::CmpHelperSTRNOTIN<char_const*,char[5]>
                    ((AssertionResult *)local_f88,(iuutil *)"null","test",
                     str.field_2._M_local_buf + 8,&null,(char (*) [5])in_R9);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f88);
          if (!bVar1) {
            memset(&local_1110,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_1110);
            pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_f88);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)&iutest_ar_9.m_result,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                       ,0x159,pcVar2,kFatalFailure);
            iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_9.m_result,&local_1110)
            ;
            iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_9.m_result);
            iutest::AssertionHelper::Fixed::~Fixed(&local_1110);
          }
          iutest_ar_1._37_3_ = 0;
          iutest_ar_1._36_1_ = !bVar1;
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_f88);
          if (iutest_ar_1._36_4_ == 0) {
            iutest::detail::AlwaysZero();
            iuutil::CmpHelperSTRNOTIN<char_const*,char[5]>
                      ((AssertionResult *)local_1168,(iuutil *)"null","test",
                       str.field_2._M_local_buf + 8,&null,(char (*) [5])in_R9);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1168);
            if (!bVar1) {
              memset(&local_12f0,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_12f0);
              pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1168);
              iutest::AssertionHelper::AssertionHelper
                        ((AssertionHelper *)&iutest_ar_10.m_result,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                         ,0x15a,pcVar2,kNonFatalFailure);
              iutest::AssertionHelper::operator=
                        ((AssertionHelper *)&iutest_ar_10.m_result,&local_12f0);
              iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_10.m_result);
              iutest::AssertionHelper::Fixed::~Fixed(&local_12f0);
            }
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1168);
            iutest::detail::AlwaysZero();
            iuutil::CmpHelperSTRNOTIN<char_const*,char[5]>
                      ((AssertionResult *)local_1348,(iuutil *)"null","test",
                       str.field_2._M_local_buf + 8,&null,(char (*) [5])in_R9);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1348);
            if (!bVar1) {
              memset(&local_14d0,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_14d0);
              pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1348);
              iutest::AssertionHelper::AssertionHelper
                        ((AssertionHelper *)&iutest_ar_11.m_result,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                         ,0x15b,pcVar2,kWarning);
              iutest::AssertionHelper::operator=
                        ((AssertionHelper *)&iutest_ar_11.m_result,&local_14d0);
              iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_11.m_result);
              iutest::AssertionHelper::Fixed::~Fixed(&local_14d0);
            }
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1348);
            iutest::detail::AlwaysZero();
            iuutil::CmpHelperSTRNOTIN<char_const*,char[5]>
                      ((AssertionResult *)local_1528,(iuutil *)"null","test",
                       str.field_2._M_local_buf + 8,&null,(char (*) [5])in_R9);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1528);
            if (!bVar1) {
              memset(&local_16b0,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_16b0);
              pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1528);
              iutest::AssertionHelper::AssertionHelper
                        (&local_16e0,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                         ,0x15c,pcVar2,kAssumeFailure);
              iutest::AssertionHelper::operator=(&local_16e0,&local_16b0);
              iutest::AssertionHelper::~AssertionHelper(&local_16e0);
              iutest::AssertionHelper::Fixed::~Fixed(&local_16b0);
            }
            iutest_ar_1._37_3_ = 0;
            iutest_ar_1._36_1_ = !bVar1;
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1528);
            if (iutest_ar_1._36_4_ == 0) {
              iutest_ar_1._36_4_ = 0;
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

IUTEST(AssertionTest, STRNOTIN)
{
    const char test[] = "test";
    const char* null = NULL;
    ::std::string str = test;
    IUTEST_ASSERT_STRNOTIN("Tes", test);
    IUTEST_EXPECT_STRNOTIN("Tes", test);
    IUTEST_INFORM_STRNOTIN("Tes", test);
    IUTEST_ASSUME_STRNOTIN("Tes", test);

    IUTEST_ASSERT_STRNOTIN("Tes", str);
    IUTEST_EXPECT_STRNOTIN("Tes", str);
    IUTEST_INFORM_STRNOTIN("Tes", str);
    IUTEST_ASSUME_STRNOTIN("Tes", str);

    IUTEST_ASSERT_STRNOTIN(null, test);
    IUTEST_EXPECT_STRNOTIN(null, test);
    IUTEST_INFORM_STRNOTIN(null, test);
    IUTEST_ASSUME_STRNOTIN(null, test);
}